

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffptbb(fitsfile *fptr,LONGLONG firstrow,LONGLONG firstchar,LONGLONG nchars,uchar *values,
          int *status)

{
  FITSfile *pFVar1;
  long firstrow_00;
  int iVar2;
  long lVar3;
  long nrows;
  char message [81];
  char local_88 [88];
  
  if (nchars < 1 || 0 < *status) {
    return *status;
  }
  if (firstrow < 1) {
    *status = 0x133;
    return 0x133;
  }
  if (firstchar < 1) {
    *status = 0x134;
    return 0x134;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if (fptr->Fptr->datastart < 0) {
      ffrdef(fptr,status);
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  firstrow_00 = pFVar1->numrows;
  lVar3 = (nchars + firstchar + -2) / pFVar1->rowlength + firstrow;
  nrows = lVar3 - firstrow_00;
  if (nrows != 0 && firstrow_00 <= lVar3) {
    if ((pFVar1->lasthdu == 0) || (0 < pFVar1->heapsize)) {
      iVar2 = ffirow(fptr,firstrow_00,nrows,status);
      if (0 < iVar2) {
        snprintf(local_88,0x51,"ffptbb failed to add space for %.0f new rows in table.",
                 (double)nrows);
        ffpmsg(local_88);
        goto LAB_001c28f7;
      }
    }
    else {
      pFVar1->heapstart = pFVar1->heapstart + nrows * pFVar1->rowlength;
      pFVar1->numrows = lVar3;
    }
  }
  ffmbyt(fptr,firstchar + fptr->Fptr->datastart + -1 + (firstrow + -1) * fptr->Fptr->rowlength,1,
         status);
  ffpbyt(fptr,nchars,values,status);
LAB_001c28f7:
  return *status;
}

Assistant:

int ffptbb(fitsfile *fptr,        /* I - FITS file pointer                 */
           LONGLONG firstrow,         /* I - starting row (1 = first row)      */
           LONGLONG firstchar,        /* I - starting byte in row (1=first)    */
           LONGLONG nchars,           /* I - number of bytes to write          */
           unsigned char *values, /* I - array of bytes to write           */
           int *status)           /* IO - error status                     */
/*
  write a consecutive string of bytes to an ascii or binary table.
  This will span multiple rows of the table if nchars + firstchar is
  greater than the length of a row.
*/
{
    LONGLONG bytepos, endrow, nrows;
    char message[FLEN_ERRMSG];

    if (*status > 0 || nchars <= 0)
        return(*status);

    else if (firstrow < 1)
        return(*status=BAD_ROW_NUM);

    else if (firstchar < 1)
        return(*status=BAD_ELEM_NUM);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart < 0) /* rescan header if data undefined */
        ffrdef(fptr, status);

    endrow = ((firstchar + nchars - 2) / (fptr->Fptr)->rowlength) + firstrow;

    /* check if we are writing beyond the current end of table */
    if (endrow > (fptr->Fptr)->numrows)
    {
        /* if there are more HDUs following the current one, or */
        /* if there is a data heap, then we must insert space */
        /* for the new rows.  */
        if ( !((fptr->Fptr)->lasthdu) || (fptr->Fptr)->heapsize > 0)
        {
            nrows = endrow - ((fptr->Fptr)->numrows);

            /* ffirow also updates the heap address and numrows */
            if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
            {
                 snprintf(message, FLEN_ERRMSG,
                 "ffptbb failed to add space for %.0f new rows in table.",
                         (double) nrows);
                 ffpmsg(message);
                 return(*status);
            }
        }
        else
        {
            /* manally update heap starting address */
            (fptr->Fptr)->heapstart += 
            ((LONGLONG)(endrow - (fptr->Fptr)->numrows) * 
                    (fptr->Fptr)->rowlength );

            (fptr->Fptr)->numrows = endrow; /* update number of rows */
        }
    }

    /* move the i/o pointer to the start of the sequence of characters */
    bytepos = (fptr->Fptr)->datastart +
              ((fptr->Fptr)->rowlength * (firstrow - 1)) +
              firstchar - 1;

    ffmbyt(fptr, bytepos, IGNORE_EOF, status);
    ffpbyt(fptr, nchars, values, status);  /* write the bytes */

    return(*status);
}